

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O0

void __thiscall test_suite::detail::simple_runner::summary::summary(summary *this,summary *other)

{
  summary *other_local;
  summary *this_local;
  memory_order __b_1;
  memory_order __b;
  
  this->name = other->name;
  (this->start).__d.__r = (other->start).__d.__r;
  (this->elapsed).__r = (other->elapsed).__r;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::atomic<unsigned_long>::atomic
            (&this->failed,(other->failed).super___atomic_base<unsigned_long>._M_i);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::atomic<unsigned_long>::atomic
            (&this->total,(other->total).super___atomic_base<unsigned_long>._M_i);
  return;
}

Assistant:

summary(summary const& other) noexcept
        : name(other.name)
        , start(other.start)
        , elapsed(other.elapsed)
        , failed(other.failed.load())
        , total(other.total.load())
    {
    }